

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

QPDFMatrix * __thiscall
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement
          (QPDFMatrix *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          Rectangle rect,bool invert_transformations,bool allow_shrink,bool allow_expand)

{
  undefined1 auVar1 [16];
  Rectangle r;
  Rectangle r_00;
  bool bVar2;
  undefined1 auVar3 [16];
  QPDFObjectHandle fdict;
  QPDFMatrix wmatrix;
  QPDFObjectHandle bbox_obj;
  Rectangle bbox;
  QPDFMatrix fmatrix;
  QPDFMatrix tmatrix;
  Rectangle local_1e8;
  QPDFMatrix local_1c8;
  string local_198;
  QPDFMatrix local_178;
  QPDFObjectHandle local_148;
  Matrix local_138;
  QPDFObjectHandle local_108;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double *local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  QPDFMatrix local_98;
  QPDFMatrix local_68;
  
  QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_198);
  local_178.a = (double)&local_178.c;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"/BBox","");
  QPDFObjectHandle::getKey(&local_148,&local_198);
  if ((double *)local_178.a != &local_178.c) {
    operator_delete((void *)local_178.a,(long)local_178.c + 1);
  }
  bVar2 = QPDFObjectHandle::isRectangle(&local_148);
  if (!bVar2) {
    QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
    goto LAB_001db26f;
  }
  QPDFMatrix::QPDFMatrix(&local_178);
  QPDFMatrix::QPDFMatrix(&local_68);
  QPDFMatrix::QPDFMatrix(&local_98);
  if (invert_transformations) {
    getMatrixForTransformations(&local_138,this,true);
    QPDFMatrix::QPDFMatrix(&local_1c8,&local_138);
    local_68.e = local_1c8.e;
    local_68.f = local_1c8.f;
    local_68.c = local_1c8.c;
    local_68.d = local_1c8.d;
    local_68.a = local_1c8.a;
    local_68.b = local_1c8.b;
    QPDFMatrix::concat(&local_178,&local_68);
  }
  local_1c8.a = (double)&local_1c8.c;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"/Matrix","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_138,&local_198);
  bVar2 = QPDFObjectHandle::isMatrix((QPDFObjectHandle *)&local_138);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.b !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.b);
  }
  if ((double *)local_1c8.a != &local_1c8.c) {
    operator_delete((void *)local_1c8.a,(long)local_1c8.c + 1);
  }
  if (bVar2) {
    local_1e8.llx = (double)&local_1e8.urx;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"/Matrix","");
    QPDFObjectHandle::getKey(&local_108,&local_198);
    QPDFObjectHandle::getArrayAsMatrix(&local_138,&local_108);
    QPDFMatrix::QPDFMatrix(&local_1c8,&local_138);
    local_98.e = local_1c8.e;
    local_98.f = local_1c8.f;
    local_98.c = local_1c8.c;
    local_98.d = local_1c8.d;
    local_98.a = local_1c8.a;
    local_98.b = local_1c8.b;
    if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((double *)local_1e8.llx != &local_1e8.urx) {
      operator_delete((void *)local_1e8.llx,(long)local_1e8.urx + 1);
    }
    QPDFMatrix::concat(&local_178,&local_98);
  }
  QPDFObjectHandle::getArrayAsRectangle((Rectangle *)&local_138,&local_148);
  r.lly = local_138.b;
  r.llx = local_138.a;
  r.urx = local_138.c;
  r.ury = local_138.d;
  QPDFMatrix::transformRectangle(&local_1e8,&local_178,r);
  if (((local_1e8.urx == local_1e8.llx) && (!NAN(local_1e8.urx) && !NAN(local_1e8.llx))) ||
     ((local_1e8.ury == local_1e8.lly && (!NAN(local_1e8.ury) && !NAN(local_1e8.lly))))) {
    QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
    goto LAB_001db26f;
  }
  local_b8 = rect.urx;
  dStack_b0 = rect.ury;
  local_a8 = rect.llx;
  dStack_a0 = rect.lly;
  auVar3._0_8_ = rect.urx - rect.llx;
  auVar3._8_8_ = rect.ury - rect.lly;
  auVar1._8_4_ = SUB84(local_1e8.ury - local_1e8.lly,0);
  auVar1._0_8_ = local_1e8.urx - local_1e8.llx;
  auVar1._12_4_ = (int)((ulong)(local_1e8.ury - local_1e8.lly) >> 0x20);
  local_198.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )divpd(auVar3,auVar1);
  if (local_198.field_2._8_8_ <= (double)local_198.field_2._M_allocated_capacity) {
    local_198.field_2._M_allocated_capacity = (size_type)local_198.field_2._8_8_;
  }
  if (local_198.field_2._0_8_ <= 1.0) {
    if (local_198.field_2._0_8_ < 1.0 && !allow_shrink) goto LAB_001db31e;
  }
  else if (!allow_expand) {
LAB_001db31e:
    local_198.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )ZEXT816(0x3ff0000000000000);
  }
  QPDFMatrix::QPDFMatrix(&local_1c8);
  local_178.e = local_1c8.e;
  local_178.f = local_1c8.f;
  local_178.c = local_1c8.c;
  local_178.d = local_1c8.d;
  local_178.a = local_1c8.a;
  local_178.b = local_1c8.b;
  QPDFMatrix::scale(&local_178,(double)local_198.field_2._M_allocated_capacity,
                    (double)local_198.field_2._0_8_);
  QPDFMatrix::concat(&local_178,&local_68);
  QPDFMatrix::concat(&local_178,&local_98);
  r_00.lly = local_138.b;
  r_00.llx = local_138.a;
  r_00.urx = local_138.c;
  r_00.ury = local_138.d;
  QPDFMatrix::transformRectangle((Rectangle *)&local_1c8,&local_178,r_00);
  local_1e8.urx = local_1c8.c;
  local_1e8.ury = local_1c8.d;
  local_1e8.llx = local_1c8.a;
  local_1e8.lly = local_1c8.b;
  local_c8 = (double *)local_1c8.a;
  uStack_c0 = 0;
  local_e8 = local_1c8.b;
  uStack_e0 = 0;
  local_d8 = local_1c8.c;
  uStack_d0 = 0;
  local_f8 = local_1c8.d;
  uStack_f0 = 0;
  QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
  QPDFMatrix::translate
            (__return_storage_ptr__,
             (local_a8 + local_b8) * 0.5 - (local_d8 + (double)local_c8) * 0.5,
             (dStack_a0 + dStack_b0) * 0.5 - (local_f8 + local_e8) * 0.5);
  QPDFMatrix::scale(__return_storage_ptr__,(double)local_198.field_2._M_allocated_capacity,
                    (double)local_198.field_2._0_8_);
  QPDFMatrix::concat(__return_storage_ptr__,&local_68);
LAB_001db26f:
  if (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFMatrix
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement(
    QPDFObjectHandle fo,
    QPDFObjectHandle::Rectangle rect,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    // Calculate the transformation matrix that will place the given form XObject fully inside the
    // given rectangle, center and shrinking or expanding as needed if requested.

    // When rendering a form XObject, the transformation in the graphics state (cm) is applied first
    // (of course -- when it is applied, the PDF interpreter doesn't even know we're going to be
    // drawing a form XObject yet), and then the object's matrix (M) is applied. The resulting
    // matrix, when applied to the form XObject's bounding box, will generate a new rectangle. We
    // want to create a transformation matrix that make the form XObject's bounding box land in
    // exactly the right spot.

    QPDFObjectHandle fdict = fo.getDict();
    QPDFObjectHandle bbox_obj = fdict.getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        return {};
    }

    QPDFMatrix wmatrix; // work matrix
    QPDFMatrix tmatrix; // "to" matrix
    QPDFMatrix fmatrix; // "from" matrix
    if (invert_transformations) {
        // tmatrix inverts scaling and rotation of the destination page. Applying this matrix allows
        // the overlaid form XObject's to be absolute rather than relative to properties of the
        // destination page. tmatrix is part of the computed transformation matrix.
        tmatrix = QPDFMatrix(getMatrixForTransformations(true));
        wmatrix.concat(tmatrix);
    }
    if (fdict.getKey("/Matrix").isMatrix()) {
        // fmatrix is the transformation matrix that is applied to the form XObject itself. We need
        // this for calculations, but we don't explicitly use it in the final result because the PDF
        // rendering system automatically applies this last before
        // drawing the form XObject.
        fmatrix = QPDFMatrix(fdict.getKey("/Matrix").getArrayAsMatrix());
        wmatrix.concat(fmatrix);
    }

    // The current wmatrix handles transformation from the form xobject and, if requested, the
    // destination page. Next, we have to adjust this for scale and position.

    // Step 1: figure out what scale factor we need to make the form XObject's bounding box fit
    // within the destination rectangle.

    // Transform bounding box
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    QPDFObjectHandle::Rectangle T = wmatrix.transformRectangle(bbox);

    // Calculate a scale factor, if needed. Shrink or expand if needed and allowed.
    if ((T.urx == T.llx) || (T.ury == T.lly)) {
        // avoid division by zero
        return {};
    }
    double rect_w = rect.urx - rect.llx;
    double rect_h = rect.ury - rect.lly;
    double t_w = T.urx - T.llx;
    double t_h = T.ury - T.lly;
    double xscale = rect_w / t_w;
    double yscale = rect_h / t_h;
    double scale = (xscale < yscale ? xscale : yscale);
    if (scale > 1.0) {
        if (!allow_expand) {
            scale = 1.0;
        }
    } else if (scale < 1.0) {
        if (!allow_shrink) {
            scale = 1.0;
        }
    }

    // Step 2: figure out what translation is required to get the rectangle to the right spot:
    // centered within the destination.
    wmatrix = QPDFMatrix();
    wmatrix.scale(scale, scale);
    wmatrix.concat(tmatrix);
    wmatrix.concat(fmatrix);

    T = wmatrix.transformRectangle(bbox);
    double t_cx = (T.llx + T.urx) / 2.0;
    double t_cy = (T.lly + T.ury) / 2.0;
    double r_cx = (rect.llx + rect.urx) / 2.0;
    double r_cy = (rect.lly + rect.ury) / 2.0;
    double tx = r_cx - t_cx;
    double ty = r_cy - t_cy;

    // Now we can calculate the final matrix. The final matrix does not include fmatrix because that
    // is applied automatically by the PDF interpreter.
    QPDFMatrix cm;
    cm.translate(tx, ty);
    cm.scale(scale, scale);
    cm.concat(tmatrix);
    return cm;
}